

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O0

int lib::string::Upper(State *state)

{
  bool bVar1;
  State *in_RDI;
  size_t i;
  string upper;
  uchar *c_str;
  size_t size;
  String *str;
  StackAPI api;
  undefined8 in_stack_ffffffffffffff90;
  ulong uVar2;
  StackAPI *in_stack_ffffffffffffff98;
  StackAPI *in_stack_ffffffffffffffa0;
  string local_58 [32];
  char *local_38;
  size_t local_30;
  String *local_28;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>
                    (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     (ValueT)in_stack_ffffffffffffff90);
  if (bVar1) {
    local_28 = luna::StackAPI::GetString
                         (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20))
    ;
    local_30 = luna::String::GetLength(local_28);
    local_38 = luna::String::GetCStr(local_28);
    std::__cxx11::string::string(local_58);
    std::__cxx11::string::reserve((ulong)local_58);
    for (uVar2 = 0; uVar2 < local_30; uVar2 = uVar2 + 1) {
      toupper((uint)(byte)local_38[uVar2]);
      std::__cxx11::string::push_back((char)local_58);
    }
    luna::StackAPI::PushString(in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98);
    local_4 = 1;
    std::__cxx11::string::~string(local_58);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Upper(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_String))
            return 0;

        auto str = api.GetString(0);
        auto size = str->GetLength();
        auto c_str = reinterpret_cast<const unsigned char *>(str->GetCStr());

        std::string upper;
        upper.reserve(size);
        for (std::size_t i = 0; i < size; ++i)
            upper.push_back(std::toupper(c_str[i]));

        api.PushString(upper);
        return 1;
    }